

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LBackward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_01;
  double *pdVar6;
  int sz;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Fad<double> sum;
  Fad<double> local_a8;
  Fad<double> local_88;
  Fad<double> local_68;
  long local_48;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  int extraout_var_00;
  
  lVar5 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar4)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  if (lVar5 != 0 && -1 < extraout_var_00) {
    do {
      lVar8 = lVar5 + -1;
      if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
        lVar11 = 0;
        local_48 = lVar8;
        do {
          local_88.val_ = 0.0;
          local_88.dx_.num_elts = 0;
          local_88.dx_.ptr_to_data = (double *)0x0;
          local_88.defaultVal = 0.0;
          iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar10 = CONCAT44(extraout_var_01,iVar4);
          while (lVar5 < lVar10) {
            lVar10 = lVar10 + -1;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_a8,this,lVar8,lVar10);
            (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(&local_68,B,lVar10,lVar11);
            local_40.fadexpr_.left_ = &local_a8;
            local_40.fadexpr_.right_ = &local_68;
            Fad<double>::operator+=(&local_88,&local_40);
            Fad<double>::~Fad(&local_68);
            Fad<double>::~Fad(&local_a8);
          }
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_68,B,lVar8);
          iVar3 = local_68.dx_.num_elts;
          iVar4 = local_88.dx_.num_elts;
          local_a8.val_ = local_68.val_ - local_88.val_;
          uVar2 = local_88.dx_.num_elts;
          if (local_88.dx_.num_elts < local_68.dx_.num_elts) {
            uVar2 = local_68.dx_.num_elts;
          }
          local_a8.dx_.num_elts = 0;
          local_a8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar2) {
            uVar9 = (ulong)uVar2;
            local_a8.dx_.num_elts = uVar2;
            local_a8.dx_.ptr_to_data = (double *)operator_new__(uVar9 * 8);
            if (0 < (int)uVar2) {
              lVar8 = 0;
              do {
                pdVar6 = (double *)((long)local_68.dx_.ptr_to_data + lVar8);
                if (iVar3 == 0) {
                  pdVar6 = &local_68.defaultVal;
                }
                pdVar7 = (double *)((long)local_88.dx_.ptr_to_data + lVar8);
                if (iVar4 == 0) {
                  pdVar7 = &local_88.defaultVal;
                }
                *(double *)((long)local_a8.dx_.ptr_to_data + lVar8) = *pdVar6 - *pdVar7;
                lVar8 = lVar8 + 8;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          lVar8 = local_48;
          local_a8.defaultVal = 0.0;
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(B,local_48,lVar11,&local_a8);
          Fad<double>::~Fad(&local_a8);
          Fad<double>::~Fad(&local_68);
          Fad<double>::~Fad(&local_88);
          lVar11 = lVar11 + 1;
        } while (lVar11 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
      }
      bVar1 = 1 < lVar5;
      lVar5 = lVar8;
    } while (bVar1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}